

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Menu.cpp
# Opt level: O0

void __thiscall Menu::Menu(Menu *this,string *param_1,string *submenuarray,int size)

{
  int local_28;
  int i;
  int size_local;
  string *submenuarray_local;
  string *param_1_local;
  Menu *this_local;
  
  this->_vptr_Menu = (_func_int **)&PTR___cxa_pure_virtual_0011acc8;
  std::__cxx11::string::string((string *)&this->title);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->subMenus);
  for (local_28 = 0; local_28 < size; local_28 = local_28 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->subMenus,submenuarray + local_28);
  }
  return;
}

Assistant:

Menu::Menu(string, string * submenuarray, int size) {
    for (int i = 0; i < size; ++i) {
        subMenus.push_back(submenuarray[i]);
    }
}